

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_hasIndex(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  long *plVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  undefined8 this;
  bool bVar4;
  int32_t iVar5;
  uint uVar6;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar7;
  undefined4 *puVar8;
  ulong uVar9;
  _func_int **pp_Var10;
  bool b;
  size_t *psVar11;
  Value index;
  Value self;
  ValueDict map;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_c0;
  bool local_b8;
  ValueDict local_b0;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_98;
  bool local_90;
  Value local_88;
  anon_union_8_3_2f476f46_for_data local_78;
  Machine *local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  Machine *local_60;
  Value local_58;
  Value local_48 [2];
  
  local_90 = false;
  pDVar7 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar7->super_RefCountedStorage).refCount = 1;
  (pDVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001bf0d8;
  pDVar7->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x5;
  pDVar7->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar8 = (undefined4 *)operator_new__(5);
  pDVar7->mSize = (long)puVar8;
  *(undefined1 *)(puVar8 + 1) = 0;
  *puVar8 = 0x666c6573;
  local_98 = pDVar7;
  Context::GetVar((Context *)local_d0,(String *)partialResult.rs,(LocalOnlyMode)&local_98);
  if ((local_98 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     (local_90 == false)) {
    plVar2 = &(local_98->super_RefCountedStorage).refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_98->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_98 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  local_b8 = false;
  pDVar7 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar7->super_RefCountedStorage).refCount = 1;
  (pDVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001bf0d8;
  pDVar7->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x6;
  pDVar7->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar8 = (undefined4 *)operator_new__(6);
  pDVar7->mSize = (long)puVar8;
  *(undefined2 *)(puVar8 + 1) = 0x78;
  *puVar8 = 0x65646e69;
  local_c0 = pDVar7;
  Context::GetVar((Context *)local_e0,(String *)partialResult.rs,(LocalOnlyMode)&local_c0);
  if ((local_c0 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     (local_b8 == false)) {
    plVar2 = &(local_c0->super_RefCountedStorage).refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_c0->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_c0 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  this = local_d0._8_8_;
  if (local_d0[0] == String) {
    if (local_e0[0] != Number) {
      local_78.tempNum._0_1_ = Value::zero;
      local_78.tempNum._1_1_ = DAT_001c12e1;
      local_78.tempNum._2_1_ = DAT_001c12e2;
      local_70 = DAT_001c12e8;
      if (DAT_001c12e8 != (Machine *)0x0 && Temp < Value::zero) {
        *(long *)&DAT_001c12e8->storeImplicit = *(long *)&DAT_001c12e8->storeImplicit + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,(Value *)&local_78);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < (byte)local_78.tempNum._0_1_) && (local_70 != (Machine *)0x0)) {
        pbVar1 = &local_70->storeImplicit;
        *(long *)pbVar1 = *(long *)pbVar1 + -1;
        if (*(long *)pbVar1 == 0) {
          (**(code **)(local_70->standardOutput + 8))();
        }
        local_70 = (Machine *)0x0;
      }
      goto LAB_001459c0;
    }
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_d0._8_8_ ==
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      uVar6 = Value::IntValue((Value *)local_e0);
      pp_Var10 = (_func_int **)0x0;
      if (-1 < (int)uVar6) {
        uVar9 = (ulong)uVar6;
        goto LAB_0014593e;
      }
    }
    else {
      *(long *)(local_d0._8_8_ + 8) = *(long *)(local_d0._8_8_ + 8) + 1;
      iVar5 = Value::IntValue((Value *)local_e0);
      pp_Var10 = ((RefCountedStorage *)(this + 0x20))->_vptr_RefCountedStorage;
      if ((long)pp_Var10 < 0) {
        StringStorage::analyzeChars((StringStorage *)this);
        pp_Var10 = ((RefCountedStorage *)(this + 0x20))->_vptr_RefCountedStorage;
      }
      uVar9 = (ulong)iVar5;
      if (SBORROW8(uVar9,-(long)pp_Var10) == (long)((long)pp_Var10 + uVar9) < 0) {
        if ((long)pp_Var10 < 0) {
          StringStorage::analyzeChars((StringStorage *)this);
          pp_Var10 = ((RefCountedStorage *)(this + 0x20))->_vptr_RefCountedStorage;
        }
LAB_0014593e:
        pp_Var10 = (_func_int **)(ulong)((long)uVar9 < (long)pp_Var10);
      }
      else {
        pp_Var10 = (_func_int **)0x0;
      }
    }
    Value::Truth((Value *)&local_68,SUB81(pp_Var10,0));
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     (Value *)&local_68);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((2 < (byte)local_68.tempNum._0_1_) && (local_60 != (Machine *)0x0)) {
      pbVar1 = &local_60->storeImplicit;
      *(long *)pbVar1 = *(long *)pbVar1 + -1;
      if (*(long *)pbVar1 == 0) {
        (**(code **)(local_60->standardOutput + 8))();
      }
      local_60 = (Machine *)0x0;
    }
LAB_001459ac:
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)this ==
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) goto LAB_001459c0;
    plVar2 = (long *)(this + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 != 0) goto LAB_001459c0;
    pp_Var10 = ((RefCountedStorage *)this)->_vptr_RefCountedStorage;
    local_b0.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)this;
  }
  else {
    if (local_d0[0] != Map) {
      if (local_d0[0] != List) {
        IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
        pLVar3 = IntrinsicResult::Null;
        (context->code).ls = IntrinsicResult::Null;
        if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
          plVar2 = &(pLVar3->super_RefCountedStorage).refCount;
          *plVar2 = *plVar2 + 1;
        }
        goto LAB_001459c0;
      }
      if (local_e0[0] != Number) {
        local_58.type = Value::zero;
        local_58.noInvoke = DAT_001c12e1;
        local_58.localOnly = DAT_001c12e2;
        local_58.data.ref = (RefCountedStorage *)DAT_001c12e8;
        if (DAT_001c12e8 != (Machine *)0x0 && Temp < Value::zero) {
          *(long *)&DAT_001c12e8->storeImplicit = *(long *)&DAT_001c12e8->storeImplicit + 1;
        }
        (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
        IntrinsicResult::ensureStorage((IntrinsicResult *)context);
        Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                   mBuf,&local_58);
        *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems
             = 1;
        if ((Temp < local_58.type) && ((Machine *)local_58.data.ref != (Machine *)0x0)) {
          pbVar1 = (bool *)&(local_58.data.ref)->refCount;
          *(long *)pbVar1 = *(long *)pbVar1 + -1;
          if (*(long *)pbVar1 == 0) {
            (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_58.data.number = 0.0;
        }
        goto LAB_001459c0;
      }
      if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_d0._8_8_ ==
          (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
        uVar6 = Value::IntValue((Value *)local_e0);
        pp_Var10 = (_func_int **)0x0;
        if (-1 < (int)uVar6) {
          uVar9 = (ulong)uVar6;
          goto LAB_001458b5;
        }
      }
      else {
        *(long *)(local_d0._8_8_ + 8) = *(long *)(local_d0._8_8_ + 8) + 1;
        iVar5 = Value::IntValue((Value *)local_e0);
        uVar9 = (ulong)iVar5;
        pp_Var10 = ((RefCountedStorage *)(this + 0x20))->_vptr_RefCountedStorage;
        if (SBORROW8(uVar9,-(long)pp_Var10) == (long)((long)pp_Var10 + uVar9) < 0) {
LAB_001458b5:
          pp_Var10 = (_func_int **)(ulong)((long)uVar9 < (long)pp_Var10);
        }
        else {
          pp_Var10 = (_func_int **)0x0;
        }
      }
      Value::Truth(local_48,SUB81(pp_Var10,0));
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,local_48);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_48[0].type) && (local_48[0].data.ref != (RefCountedStorage *)0x0)) {
        plVar2 = &(local_48[0].data.ref)->refCount;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (*(local_48[0].data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_48[0].data.number = 0.0;
      }
      goto LAB_001459ac;
    }
    Value::GetDict(&local_b0,(Value *)local_d0);
    if (local_b0.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      b = false;
    }
    else {
      uVar6 = HashValue((Value *)local_e0);
      psVar11 = (size_t *)
                (&((RefCountedStorage *)((long)local_b0.ds + 0x10))->refCount + uVar6 % 0xfb);
      do {
        psVar11 = (size_t *)*psVar11;
        b = psVar11 != (size_t *)0x0;
        if (psVar11 == (size_t *)0x0) break;
        bVar4 = Value::operator==((Value *)(psVar11 + 1),(Value *)local_e0);
      } while (!bVar4);
    }
    Value::Truth(&local_88,b);
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_88);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_88.type) && (local_88.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_88.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_88.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_88.data.number = 0.0;
    }
    local_b0._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
    if ((local_b0.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) ||
       (local_b0.isTemp != false)) goto LAB_001459c0;
    plVar2 = (long *)((long)local_b0.ds + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 != 0) goto LAB_001459c0;
    pp_Var10 = ((local_b0.ds)->super_RefCountedStorage)._vptr_RefCountedStorage;
  }
  (*pp_Var10[1])(local_b0.ds);
LAB_001459c0:
  if ((Temp < local_e0[0]) && ((RefCountedStorage *)local_e0._8_8_ != (RefCountedStorage *)0x0)) {
    plVar2 = (long *)(local_e0._8_8_ + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(*(_func_int ***)local_e0._8_8_)[1])();
    }
  }
  if ((Temp < local_d0[0]) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_d0._8_8_ !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    plVar2 = (long *)(local_d0._8_8_ + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((RefCountedStorage *)local_d0._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_hasIndex(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value index = context->GetVar("index");
		if (self.type == ValueType::List) {
			if (index.type == ValueType::Number) {
				ValueList list = self.GetList();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -list.Count() and i < list.Count()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::String) {
			if (index.type == ValueType::Number) {
				String str = self.GetString();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -str.Length() and i < str.Length()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::Map) {
			ValueDict map = self.GetDict();
			return IntrinsicResult(Value::Truth(map.ContainsKey(index)));
		}
		return IntrinsicResult::Null;
	}